

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_equation.hpp
# Opt level: O2

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_equation<viennamath::ct_variable<0UL>,_viennamath::ct_variable<1UL>_>
                    *param_2)

{
  ostream *poVar1;
  ct_variable<1UL> local_a;
  ct_variable<0UL> local_9;
  
  poVar1 = std::operator<<(stream,"ct_equation(");
  poVar1 = operator<<(poVar1,&local_9);
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = operator<<(poVar1,&local_a);
  std::operator<<(poVar1,")");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_equation<LHS, RHS> const & /*u*/)
  {
    stream << "ct_equation(" << LHS() << " = " << RHS() << ")";
    return stream;
  }